

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O0

void testopaque(wins *wins_ar,int ar_len)

{
  Am_Drawonable *pAVar1;
  Am_Image_Array local_70 [8];
  Am_Style local_68 [8];
  Am_Style foo;
  Am_Style local_58 [8];
  Am_Style opaque_style;
  Am_Image_Array grey2;
  Am_Image_Array local_38 [8];
  Am_Style local_30 [8];
  Am_Style grey_style;
  Am_Image_Array grey;
  Am_Drawonable *d;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  for (d._0_4_ = 0; (int)d < ar_len; d._0_4_ = (int)d + 1) {
    pAVar1 = wins_ar[(int)d].d3;
    (**(code **)(*(long *)pAVar1 + 0x160))();
    (**(code **)(*(long *)pAVar1 + 0x160))(pAVar1,&Am_White,&Am_Blue,0x1e,0x1e,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&grey_style,0x32);
    Am_Image_Array::Am_Image_Array(local_38,(Am_Image_Array *)&grey_style);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0,local_30,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,
                       local_38);
    Am_Image_Array::~Am_Image_Array(local_38);
    (**(code **)(*(long *)pAVar1 + 0x160))(pAVar1,&Am_White,local_30,10,10,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&opaque_style,10);
    Am_Image_Array::Am_Image_Array((Am_Image_Array *)&foo,(Am_Image_Array *)&opaque_style);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0,local_58,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,3,0,&foo);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&foo);
    (**(code **)(*(long *)pAVar1 + 0x160))(pAVar1,&Am_White,local_58,0x1e,0x1e,0x19,0x19,0);
    Am_Image_Array::Am_Image_Array(local_70,(Am_Image_Array *)&opaque_style);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0,local_68,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,
                       local_70);
    Am_Image_Array::~Am_Image_Array(local_70);
    (**(code **)(*(long *)pAVar1 + 0x160))(pAVar1,&Am_White,local_68,0x3c,0x3c,0x19,0x19,0);
    Am_Style::~Am_Style(local_68);
    Am_Style::~Am_Style(local_58);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&opaque_style);
    Am_Style::~Am_Style(local_30);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&grey_style);
  }
  return;
}

Assistant:

void
testopaque(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d3;

    d->Draw_Rectangle(Am_White, Am_Blue, 10, 10, 25, 25);

    d->Draw_Rectangle(Am_White, Am_Blue, 30, 30, 25, 25);

    Am_Image_Array grey(50);
    Am_Style grey_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                        Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                        Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                        Am_FILL_POLY_EVEN_ODD, grey);
    d->Draw_Rectangle(Am_White, grey_style, 10, 10, 25, 25);

    Am_Image_Array grey2(10);
    Am_Style opaque_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                          Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                          Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_OPAQUE_STIPPLED,
                          Am_FILL_POLY_EVEN_ODD, grey2);
    d->Draw_Rectangle(Am_White, opaque_style, 30, 30, 25, 25);

    Am_Style foo(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                 Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                 Am_FILL_POLY_EVEN_ODD, grey2);

    d->Draw_Rectangle(Am_White, foo, 60, 60, 25, 25);
  }
}